

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorclock.h
# Opt level: O2

VC_ID __thiscall
VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::get_id_by_tid
          (VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_> *this,
          TID tid)

{
  VC_ID VVar1;
  const_iterator cVar2;
  TID local_c;
  
  local_c = tid;
  cVar2 = phmap::container_internal::
          raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
          ::find<unsigned_int>
                    ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                      *)this,&local_c);
  if (cVar2.inner_.ctrl_ ==
      (this->vc).
      super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
      .
      super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
      .ctrl_ + (this->vc).
               super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
               .
               super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
               .capacity_) {
    VVar1 = 0;
  }
  else {
    VVar1 = *(VC_ID *)((long)cVar2.inner_.field_1.slot_ + 8);
  }
  return VVar1;
}

Assistant:

VC_ID get_id_by_tid(TID tid) const {
    auto it = vc.find(tid);
    if (it != vc.end()) {
      return it->second;
    } else {
      return 0;
    }
  }